

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O3

OpCode __thiscall
Js::ByteCodeReader::ReadPrefixedOp
          (ByteCodeReader *this,byte **ip,LayoutSize *layoutSize,OpCode prefix)

{
  OpCode *pOVar1;
  code *pcVar2;
  bool bVar3;
  OpCode OVar4;
  undefined4 *puVar5;
  uint16 **extIp;
  
  if (this->m_endLocation <= *ip) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0x5d,"(ip < m_endLocation)","ip < m_endLocation");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  *layoutSize = (uint)(prefix >> 1);
  pOVar1 = (OpCode *)*ip;
  if ((prefix & ExtendedOpcodePrefix) == EndOfBlock) {
    *ip = (byte *)((long)pOVar1 + 1);
    OVar4 = (OpCode)(byte)(char)*pOVar1;
  }
  else {
    *ip = (byte *)(pOVar1 + 1);
    OVar4 = *pOVar1;
  }
  return OVar4;
}

Assistant:

OpCode ByteCodeReader::ReadPrefixedOp(const byte *&ip, LayoutSize& layoutSize, OpCode prefix) const
    {
        Assert(ip < m_endLocation);
        const uint16 nPrefixes = (uint16)Js::OpCode::Nop / LayoutCount;

        // Make sure the assumption made for the order of the prefix are right
        CompileAssert((uint16)Js::OpCode::ExtendedOpcodePrefix / nPrefixes == SmallLayout);
        CompileAssert((uint16)Js::OpCode::MediumLayoutPrefix / nPrefixes == MediumLayout);
        CompileAssert((uint16)Js::OpCode::ExtendedMediumLayoutPrefix / nPrefixes == MediumLayout);
        CompileAssert((uint16)Js::OpCode::LargeLayoutPrefix / nPrefixes == LargeLayout);
        CompileAssert((uint16)Js::OpCode::ExtendedLargeLayoutPrefix / nPrefixes == LargeLayout);

        CompileAssert((uint16)Js::OpCode::MediumLayoutPrefix % nPrefixes == 0);
        CompileAssert((uint16)Js::OpCode::LargeLayoutPrefix % nPrefixes == 0);
        CompileAssert((uint16)Js::OpCode::ExtendedOpcodePrefix % nPrefixes == 1);
        CompileAssert((uint16)Js::OpCode::ExtendedMediumLayoutPrefix % nPrefixes == 1);
        CompileAssert((uint16)Js::OpCode::ExtendedLargeLayoutPrefix % nPrefixes == 1);

        uint16 shortPrefix = (uint16)prefix;
        layoutSize = (LayoutSize)(shortPrefix / nPrefixes);
        return shortPrefix & 1 ? ReadExtOp(ip) : ReadByteOp(ip);
    }